

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O0

DdManager * Llb_ImgPartition(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,abctime TimeTarget)

{
  void *pvVar1;
  uint numVars;
  int iVar2;
  int iVar3;
  DdManager *unique;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_01;
  DdNode *pDVar6;
  DdNode *n;
  void *pvVar7;
  int local_7c;
  int i;
  DdNode *bTemp;
  DdNode *bRes;
  DdNode *bProd;
  DdNode *bBdd1;
  DdNode *bBdd0;
  DdManager *dd;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vRange;
  Vec_Ptr_t *vNodes;
  abctime TimeTarget_local;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  numVars = Aig_ManObjNumMax(p);
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  for (local_7c = 0; iVar2 = Vec_PtrSize(vLower), local_7c < iVar2; local_7c = local_7c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_7c);
    iVar2 = Aig_ObjId(pAVar4);
    pDVar6 = Cudd_bddIthVar(unique,iVar2);
    (pAVar4->field_5).pData = pDVar6;
  }
  p_00 = Llb_ManCutNodes(p,vLower,vUpper);
  for (local_7c = 0; iVar2 = Vec_PtrSize(p_00), local_7c < iVar2; local_7c = local_7c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_7c);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    pvVar7 = (pAVar5->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar4);
    pAVar5 = Aig_ObjFanin1(pAVar4);
    pvVar1 = (pAVar5->field_5).pData;
    iVar3 = Aig_ObjFaninC1(pAVar4);
    pDVar6 = Cudd_bddAnd(unique,(DdNode *)((ulong)pvVar7 ^ (long)iVar2),
                         (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
    (pAVar4->field_5).pData = pDVar6;
    if ((pAVar4->field_5).pData == (void *)0x0) {
      Cudd_Quit(unique);
      Vec_PtrFree(p_00);
      return (DdManager *)0x0;
    }
    Cudd_Ref((DdNode *)(pAVar4->field_5).pData);
  }
  p_01 = Llb_ManCutRange(p,vLower,vUpper);
  bTemp = Cudd_ReadOne(unique);
  Cudd_Ref(bTemp);
  local_7c = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p_01);
    if (iVar2 <= local_7c) {
      for (local_7c = 0; iVar2 = Vec_PtrSize(p_00), local_7c < iVar2; local_7c = local_7c + 1) {
        pvVar7 = Vec_PtrEntry(p_00,local_7c);
        Cudd_RecursiveDeref(unique,*(DdNode **)((long)pvVar7 + 0x28));
      }
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_00);
      Cudd_AutodynDisable(unique);
      unique->bFunc = bTemp;
      unique->TimeStop = 0;
      return unique;
    }
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_01,local_7c);
    iVar2 = Aig_ObjIsNode(pAVar4);
    if (iVar2 == 0) break;
    iVar2 = Aig_ObjId(pAVar4);
    pDVar6 = Cudd_bddIthVar(unique,iVar2);
    pDVar6 = Cudd_bddXnor(unique,pDVar6,(DdNode *)(pAVar4->field_5).pData);
    Cudd_Ref(pDVar6);
    n = Cudd_bddAnd(unique,bTemp,pDVar6);
    if (n == (DdNode *)0x0) {
      Cudd_Quit(unique);
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_00);
      return (DdManager *)0x0;
    }
    Cudd_Ref(n);
    Cudd_RecursiveDeref(unique,bTemp);
    Cudd_RecursiveDeref(unique,pDVar6);
    local_7c = local_7c + 1;
    bTemp = n;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                ,0xdb,"DdManager *Llb_ImgPartition(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, abctime)")
  ;
}

Assistant:

DdManager * Llb_ImgPartition( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, abctime TimeTarget )
{
    Vec_Ptr_t * vNodes, * vRange;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bBdd0, * bBdd1, * bProd, * bRes, * bTemp;
    int i;

    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;

    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeTarget );  
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    bRes   = Cudd_ReadOne(dd);   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRange, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );   Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd ); Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vRange );
            Vec_PtrFree( vNodes );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vRange );
    Vec_PtrFree( vNodes );
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}